

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O1

void xcb_input_valuator_state_next(xcb_input_valuator_state_iterator_t *i)

{
  byte bVar1;
  xcb_input_valuator_state_t *pxVar2;
  xcb_input_valuator_state_t *_aux;
  
  pxVar2 = i->data;
  bVar1 = pxVar2->num_valuators;
  i->index = (int)(pxVar2 + (ulong)bVar1 + 1) - (int)pxVar2;
  i->rem = i->rem + -1;
  i->data = pxVar2 + (ulong)bVar1 + 1;
  return;
}

Assistant:

void
xcb_input_valuator_state_next (xcb_input_valuator_state_iterator_t *i)
{
    xcb_input_valuator_state_t *R = i->data;
    xcb_generic_iterator_t child;
    child.data = (xcb_input_valuator_state_t *)(((char *)R) + xcb_input_valuator_state_sizeof(R));
    i->index = (char *) child.data - (char *) i->data;
    --i->rem;
    i->data = (xcb_input_valuator_state_t *) child.data;
}